

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_functional_test.cc
# Opt level: O2

void iterator_offset_access_test(void)

{
  fdb_kvs_handle *pfVar1;
  fdb_status fVar2;
  size_t sVar3;
  size_t sVar4;
  uint uVar5;
  ulong uVar6;
  fdb_doc *doc;
  char *__format;
  long lVar7;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_doc *rdoc;
  fdb_iterator *it;
  fdb_kvs_handle *o_db;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  char keybuf [256];
  char bodybuf [256];
  fdb_config fconfig;
  fdb_doc *apfStack_1f78 [1001];
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  rdoc = (fdb_doc *)0x0;
  system("rm -rf  iterator_test* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fconfig.wal_threshold = 0x200;
  fconfig.buffercache_size = 0x1000;
  fconfig.purging_interval = 1;
  fconfig.compaction_mode = '\0';
  fconfig.flags = fconfig.purging_interval;
  fVar2 = fdb_open(&dbfile,"./iterator_test1",&fconfig);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xedb);
    iterator_offset_access_test()::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xedb,"void iterator_offset_access_test()");
  }
  fVar2 = fdb_kvs_open(dbfile,&db,"DB",&kvs_config);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xedd);
    iterator_offset_access_test()::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xedd,"void iterator_offset_access_test()");
  }
  fVar2 = fdb_kvs_open(dbfile,&o_db,"ODB",&kvs_config);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xedf);
    iterator_offset_access_test()::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xedf,"void iterator_offset_access_test()");
  }
  lVar7 = 0;
  uVar6 = 0;
  do {
    if (uVar6 == 1000) {
      fVar2 = fdb_commit(dbfile,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                ,0xef1);
        iterator_offset_access_test()::__test_pass = 1;
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                      ,0xef1,"void iterator_offset_access_test()");
      }
      uVar5 = 0xfa;
      while (uVar5 != 500) {
        sprintf(keybuf,"key%d",(ulong)uVar5);
        pfVar1 = db;
        sVar3 = strlen(keybuf);
        fVar2 = fdb_del_kv(pfVar1,keybuf,sVar3);
        uVar5 = uVar5 + 1;
        if (fVar2 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xef6);
          iterator_offset_access_test()::__test_pass = 1;
          __assert_fail("s == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                        ,0xef6,"void iterator_offset_access_test()");
        }
      }
      lVar7 = 0;
      uVar6 = 0;
      while (uVar6 != 0xfa) {
        sprintf(keybuf,"k0y%d",uVar6 & 0xffffffff);
        sprintf(bodybuf,"b0dy%d",uVar6 & 0xffffffff);
        fdb_doc_free(apfStack_1f78[uVar6]);
        sVar3 = strlen(keybuf);
        sVar4 = strlen(bodybuf);
        fdb_doc_create((fdb_doc **)((long)apfStack_1f78 + lVar7),keybuf,sVar3,(void *)0x0,0,bodybuf,
                       sVar4);
        fVar2 = fdb_set(db,apfStack_1f78[uVar6]);
        uVar6 = uVar6 + 1;
        lVar7 = lVar7 + 8;
        if (fVar2 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xf01);
          iterator_offset_access_test()::__test_pass = 1;
          __assert_fail("s == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                        ,0xf01,"void iterator_offset_access_test()");
        }
      }
      fVar2 = fdb_commit(dbfile,'\0');
      if (fVar2 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                ,0xf05);
        iterator_offset_access_test()::__test_pass = 1;
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                      ,0xf05,"void iterator_offset_access_test()");
      }
      fdb_iterator_init(o_db,&it,(void *)0x0,0,(void *)0x0,0,2);
      uVar6 = 500;
      while( true ) {
        if (999 < uVar6) {
          fdb_iterator_close(it);
          fVar2 = fdb_commit(dbfile,'\x01');
          if (fVar2 != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xf22);
            iterator_offset_access_test()::__test_pass = 1;
            __assert_fail("s == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                          ,0xf22,"void iterator_offset_access_test()");
          }
          uVar5 = 0;
          do {
            if (uVar5 == 0xfa) {
              uVar6 = 500;
              while( true ) {
                if (999 < uVar6) {
                  for (lVar7 = 0; lVar7 != 1000; lVar7 = lVar7 + 1) {
                    fdb_doc_free(apfStack_1f78[lVar7]);
                  }
                  fdb_doc_free(rdoc);
                  fdb_close(dbfile);
                  fdb_shutdown();
                  memleak_end();
                  __format = "%s PASSED\n";
                  if (iterator_offset_access_test()::__test_pass != '\0') {
                    __format = "%s FAILED\n";
                  }
                  fprintf(_stderr,__format,"iterator offset access test");
                  return;
                }
                fVar2 = fdb_get_byoffset(db,apfStack_1f78[uVar6]);
                if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) break;
                if (apfStack_1f78[uVar6]->deleted == false) {
                  fprintf(_stderr,"Test failed: %s %d\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                          ,0xf34);
                  iterator_offset_access_test()::__test_pass = '\x01';
                  if (apfStack_1f78[uVar6]->deleted == false) {
                    __assert_fail("doc[i]->deleted == true",
                                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                                  ,0xf34,"void iterator_offset_access_test()");
                  }
                }
                uVar6 = uVar6 + 10;
              }
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                      ,0xf31);
              iterator_offset_access_test()::__test_pass = 1;
              __assert_fail("s == FDB_RESULT_KEY_NOT_FOUND",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                            ,0xf31,"void iterator_offset_access_test()");
            }
            sprintf(keybuf,"k1y%d",(ulong)uVar5);
            sprintf(bodybuf,"b1dy%d",(ulong)uVar5);
            pfVar1 = db;
            sVar3 = strlen(keybuf);
            sVar4 = strlen(bodybuf);
            fVar2 = fdb_set_kv(pfVar1,keybuf,sVar3,bodybuf,sVar4);
            uVar5 = uVar5 + 1;
          } while (fVar2 == FDB_RESULT_SUCCESS);
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xf29);
          iterator_offset_access_test()::__test_pass = 1;
          __assert_fail("s == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                        ,0xf29,"void iterator_offset_access_test()");
        }
        fVar2 = fdb_get_byoffset(db,apfStack_1f78[uVar6]);
        if (fVar2 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xf0f);
          iterator_offset_access_test()::__test_pass = 1;
          __assert_fail("s == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                        ,0xf0f,"void iterator_offset_access_test()");
        }
        fVar2 = fdb_iterator_seek(it,apfStack_1f78[uVar6]->key,apfStack_1f78[uVar6]->keylen,'\0');
        if (fVar2 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xf13);
          iterator_offset_access_test()::__test_pass = 1;
          __assert_fail("s == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                        ,0xf13,"void iterator_offset_access_test()");
        }
        fVar2 = fdb_iterator_get(it,&rdoc);
        if (fVar2 != FDB_RESULT_SUCCESS) break;
        doc = apfStack_1f78[uVar6];
        if (*rdoc->body != doc->offset) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                 );
          iterator_offset_access_test()::__test_pass = '\x01';
          doc = apfStack_1f78[uVar6];
          if (*rdoc->body != doc->offset) {
            __assert_fail("*((uint64_t *)rdoc->body) == doc[i]->offset",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                          ,0xf16,"void iterator_offset_access_test()");
          }
        }
        fVar2 = fdb_del(db,doc);
        if (fVar2 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xf1a);
          iterator_offset_access_test()::__test_pass = 1;
          __assert_fail("s == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                        ,0xf1a,"void iterator_offset_access_test()");
        }
        fdb_get_metaonly(db,apfStack_1f78[uVar6]);
        uVar6 = uVar6 + 10;
      }
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xf15);
      iterator_offset_access_test()::__test_pass = 1;
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xf15,"void iterator_offset_access_test()");
    }
    sprintf(keybuf,"key%d",uVar6 & 0xffffffff);
    sprintf(bodybuf,"body%d",uVar6 & 0xffffffff);
    sVar3 = strlen(keybuf);
    sVar4 = strlen(bodybuf);
    fdb_doc_create((fdb_doc **)((long)apfStack_1f78 + lVar7),keybuf,sVar3,(void *)0x0,0,bodybuf,
                   sVar4);
    fVar2 = fdb_set(db,apfStack_1f78[uVar6]);
    pfVar1 = o_db;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xee8);
      iterator_offset_access_test()::__test_pass = 1;
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xee8,"void iterator_offset_access_test()");
    }
    sVar3 = strlen(keybuf);
    fVar2 = fdb_set_kv(pfVar1,keybuf,sVar3,&apfStack_1f78[uVar6]->offset,8);
    uVar6 = uVar6 + 1;
    lVar7 = lVar7 + 8;
  } while (fVar2 == FDB_RESULT_SUCCESS);
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
          ,0xeed);
  iterator_offset_access_test()::__test_pass = 1;
  __assert_fail("s == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                ,0xeed,"void iterator_offset_access_test()");
}

Assistant:

void iterator_offset_access_test()
{
    TEST_INIT();
    memleak_start();


    int i, r;
    int n = 1000;
    char keybuf[256], bodybuf[256];
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db, *o_db;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc = NULL;
    fdb_status s;
    fdb_iterator *it;

    // remove  all previous iterator_test files
    r = system(SHELL_DEL" iterator_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.wal_threshold = 512;
    fconfig.buffercache_size = 4096;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_mode = FDB_COMPACTION_MANUAL;
    fconfig.purging_interval = 1; // retain deletes until compaction

    // open db
    s = fdb_open(&dbfile, "./iterator_test1", &fconfig);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_kvs_open(dbfile, &db, "DB", &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_kvs_open(dbfile, &o_db,"ODB", &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // set docs
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            NULL, 0, (void*)bodybuf, strlen(bodybuf));
        s = fdb_set(db, doc[i]);
        TEST_CHK(s == FDB_RESULT_SUCCESS);

        // set in offset verification index
        s = fdb_set_kv(o_db, keybuf, strlen(keybuf),
                        &doc[i]->offset, sizeof(uint64_t));
        TEST_CHK(s == FDB_RESULT_SUCCESS);
    }

    s = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    // delete some
     for (i=n/4;i<n/2;++i){
        sprintf(keybuf, "key%d", i);
        s = fdb_del_kv(db, (void*)keybuf, strlen(keybuf));
        TEST_CHK(s == FDB_RESULT_SUCCESS);
    }

    // update initial n/4 docs
    for (i=0;i<n/4;++i){
        sprintf(keybuf, "k0y%d", i);
        sprintf(bodybuf, "b0dy%d", i);
        fdb_doc_free(doc[i]);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            NULL, 0, (void*)bodybuf, strlen(bodybuf));
        s = fdb_set(db, doc[i]);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
    }

    s = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // create iterator with no deletes
    fdb_iterator_init(o_db, &it, NULL, 0, NULL, 0, FDB_ITR_NO_DELETES);

    // only 2nd half of docs should exist at original offset
    for (i=n/2;i<n;i+=10){

        // get by offset
        s = fdb_get_byoffset(db, doc[i]);
        TEST_CHK(s == FDB_RESULT_SUCCESS);

        // seek to in verificaiton db
        s = fdb_iterator_seek(it, doc[i]->key, doc[i]->keylen, 0);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        s = fdb_iterator_get(it, &rdoc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CHK(*((uint64_t *)rdoc->body) == doc[i]->offset);

        // delete
        s = fdb_del(db, doc[i]);
        TEST_CHK(s == FDB_RESULT_SUCCESS);

        // track new offset storing in doc[i]
        fdb_get_metaonly(db, doc[i]);
    }

    fdb_iterator_close(it);
    s = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // do some sets passed recorded offset
    for (i=0;i<n/4;++i){
        sprintf(keybuf, "k1y%d", i);
        sprintf(bodybuf, "b1dy%d", i);
        s = fdb_set_kv(db, keybuf, strlen(keybuf), bodybuf, strlen(bodybuf));
        TEST_CHK(s == FDB_RESULT_SUCCESS);
    }

    // known offsets exist between n/2 - n
    for (i=n/2;i<n;i+=10){

        // verify can get by offset from main db
        s = fdb_get_byoffset(db, doc[i]);
        TEST_CHK(s == FDB_RESULT_KEY_NOT_FOUND);

        // should be deleted now at new offset
        TEST_CHK(doc[i]->deleted == true);
    }

    for(i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    fdb_doc_free(rdoc);
    fdb_close(dbfile);
    fdb_shutdown();

    memleak_end();
    TEST_RESULT("iterator offset access test");
}